

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vVolume)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if ((*(uint *)&pObj->field_0x14 & 0x40) == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
    if ((pObj->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                    ,0x18c,"void Abc_NodeSuperChoiceCollect2_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    Abc_NodeSuperChoiceCollect2_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vVolume);
    Abc_NodeSuperChoiceCollect2_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vVolume);
    uVar1 = vVolume->nSize;
    if (uVar1 == vVolume->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVolume->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVolume->pArray,0x80);
        }
        vVolume->pArray = ppvVar3;
        vVolume->nCap = 0x10;
      }
      else {
        if (vVolume->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVolume->pArray,(ulong)uVar1 << 4);
        }
        vVolume->pArray = ppvVar3;
        vVolume->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vVolume->pArray;
    }
    iVar2 = vVolume->nSize;
    vVolume->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect2_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin0(pObj), vVolume );
    Abc_NodeSuperChoiceCollect2_rec( Abc_ObjFanin1(pObj), vVolume );
    Vec_PtrPush( vVolume, pObj );
}